

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_manager.cpp
# Opt level: O1

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::BlockManager::RegisterBlock(BlockManager *this,block_id_t block_id)

{
  _Atomic_word *p_Var1;
  long *plVar2;
  int iVar3;
  mapped_type *pmVar4;
  ulong in_RDX;
  ulong uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar6;
  long *plVar7;
  long *plVar8;
  shared_ptr<duckdb::BlockHandle,_true> sVar9;
  MemoryTag local_3a;
  undefined1 local_39;
  ulong local_38;
  mapped_type local_30;
  
  local_38 = in_RDX;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(block_id + 0x10));
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  uVar5 = local_38 % *(ulong *)(block_id + 0x40);
  plVar7 = *(long **)(*(long *)(block_id + 0x38) + uVar5 * 8);
  plVar8 = (long *)0x0;
  if ((plVar7 != (long *)0x0) &&
     (plVar2 = (long *)*plVar7, plVar8 = plVar7, local_38 != ((long *)*plVar7)[1])) {
    while (plVar7 = plVar2, plVar2 = (long *)*plVar7, plVar2 != (long *)0x0) {
      plVar8 = (long *)0x0;
      if (((ulong)plVar2[1] % *(ulong *)(block_id + 0x40) != uVar5) ||
         (plVar8 = plVar7, local_38 == plVar2[1])) goto LAB_0104c1b1;
    }
    plVar8 = (long *)0x0;
  }
LAB_0104c1b1:
  if (plVar8 == (long *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar6 = *plVar8;
  }
  if (lVar6 != 0) {
    weak_ptr<duckdb::BlockHandle,_true>::lock((weak_ptr<duckdb::BlockHandle,_true> *)this);
    if (this->_vptr_BlockManager != (_func_int **)0x0) goto LAB_0104c2c1;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->buffer_manager !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->buffer_manager);
    }
  }
  local_3a = BASE_TABLE;
  local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::BlockHandle,std::allocator<duckdb::BlockHandle>,duckdb::BlockManager&,long&,duckdb::MemoryTag>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(BlockHandle **)&local_30,(allocator<duckdb::BlockHandle> *)&local_39,
             (BlockManager *)block_id,(long *)&local_38,&local_3a);
  shared_ptr<duckdb::BlockHandle,_true>::shared_ptr
            ((shared_ptr<duckdb::BlockHandle,_true> *)this,
             (shared_ptr<duckdb::BlockHandle> *)&local_30);
  if (local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this->_vptr_BlockManager;
  local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this->buffer_manager;
  if (local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count =
           (local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_weak_count + 1;
    }
  }
  pmVar4 = ::std::__detail::
           _Map_base<long,_std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<long,_std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>,_std::allocator<std::pair<const_long,_duckdb::weak_ptr<duckdb::BlockHandle,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)(block_id + 0x38),(key_type *)&local_38);
  if (pmVar4 != &local_30) {
    (pmVar4->internal).super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pmVar4->internal).super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  if (local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi)->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = (local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*(local_30.internal.super___weak_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
LAB_0104c2c1:
  pthread_mutex_unlock((pthread_mutex_t *)(block_id + 0x10));
  sVar9.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar9.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar9.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> BlockManager::RegisterBlock(block_id_t block_id) {
	lock_guard<mutex> lock(blocks_lock);
	// check if the block already exists
	auto entry = blocks.find(block_id);
	if (entry != blocks.end()) {
		// already exists: check if it hasn't expired yet
		auto existing_ptr = entry->second.lock();
		if (existing_ptr) {
			//! it hasn't! return it
			return existing_ptr;
		}
	}
	// create a new block pointer for this block
	auto result = make_shared_ptr<BlockHandle>(*this, block_id, MemoryTag::BASE_TABLE);
	// register the block pointer in the set of blocks as a weak pointer
	blocks[block_id] = weak_ptr<BlockHandle>(result);
	return result;
}